

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O0

void __thiscall FIX42::MarketDataRequest::NoRelatedSym::NoRelatedSym(NoRelatedSym *this)

{
  undefined4 local_e8 [2];
  undefined4 local_e0;
  undefined4 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined4 local_70;
  undefined1 *local_60;
  Group *local_58;
  int local_4c;
  message_order *local_48;
  message_order local_30 [32];
  NoRelatedSym *local_10;
  NoRelatedSym *this_local;
  
  local_60 = (undefined1 *)local_e8;
  local_70 = 0;
  local_78 = 0x150;
  local_80 = 0x15f;
  local_88 = 0x15e;
  local_90 = 0x6b;
  local_98 = 0x15d;
  local_a0 = 0x15c;
  local_a8 = 0x6a;
  local_b0 = 0xcf;
  local_b8 = 0xdf;
  local_c0 = 0xe7;
  local_c8 = 0xce;
  local_d0 = 0xca;
  local_d8 = 0xc9;
  local_e0 = 0xcd;
  local_e8[0] = 200;
  local_48 = local_30;
  local_4c = 0x37;
  local_58 = &this->super_Group;
  local_10 = this;
  FIX::message_order::message_order(local_48,0x37,0x41,0x30,0x16,0xa7);
  FIX::Group::Group(local_58,0x92,local_4c,local_48);
  FIX::message_order::~message_order(local_30);
  *(undefined ***)local_58 = &PTR__NoRelatedSym_00185708;
  return;
}

Assistant:

NoRelatedSym() : FIX::Group(146,55,FIX::message_order(55,65,48,22,167,200,205,201,202,206,231,223,207,106,348,349,107,350,351,336,0)) {}